

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshBuffer.h
# Opt level: O3

void __thiscall
irr::scene::CMeshBuffer<irr::video::S3DVertex>::CMeshBuffer
          (CMeshBuffer<irr::video::S3DVertex> *this)

{
  *(undefined8 *)&this->field_0x140 = 0;
  *(undefined4 *)&this->field_0x148 = 1;
  (this->super_IMeshBuffer)._vptr_IMeshBuffer = (_func_int **)0x2604b0;
  *(undefined8 *)&this->field_0x138 = 0x2605d0;
  *(undefined8 *)&(this->super_IMeshBuffer).field_0x8 = 0x100000001;
  *(undefined8 *)&(this->super_IMeshBuffer).field_0x10 = 0;
  *(undefined8 *)&(this->super_IMeshBuffer).field_0x18 = 0;
  video::SMaterial::SMaterial(&this->Material);
  (this->Vertices).m_data.
  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Vertices).m_data.
  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Vertices).m_data.
  super__Vector_base<irr::video::S3DVertex,_std::allocator<irr::video::S3DVertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Vertices).is_sorted = true;
  (this->Indices).m_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Indices).m_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Indices).m_data.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Indices).is_sorted = true;
  (this->BoundingBox).MinEdge.X = -1.0;
  (this->BoundingBox).MinEdge.Y = -1.0;
  *(undefined8 *)&(this->BoundingBox).MinEdge.Z = 0x3f800000bf800000;
  (this->BoundingBox).MaxEdge.Y = 1.0;
  (this->BoundingBox).MaxEdge.Z = 1.0;
  this->PrimitiveType = EPT_TRIANGLES;
  return;
}

Assistant:

CMeshBuffer() :
			ChangedID_Vertex(1), ChangedID_Index(1), MappingHint_Vertex(EHM_NEVER), MappingHint_Index(EHM_NEVER), HWBuffer(NULL), PrimitiveType(EPT_TRIANGLES)
	{
#ifdef _DEBUG
		setDebugName("CMeshBuffer");
#endif
	}